

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O2

shared_ptr<f8n::prefs::Preferences> __thiscall
f8n::prefs::Preferences::ForComponent(Preferences *this,string *c,Mode mode)

{
  pointer pcVar1;
  int iVar2;
  tuple<char_*,_std::default_delete<char[]>_> __s;
  iterator iVar3;
  Preferences *this_00;
  __weak_ptr<f8n::prefs::Preferences,(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong __maxlen;
  shared_ptr<f8n::prefs::Preferences> sVar4;
  allocator<char> local_89;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_88;
  weak_ptr<f8n::prefs::Preferences> weak;
  string key;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&cacheMutex);
  std::__cxx11::string::string<std::allocator<char>>((string *)&weak,"%s-%d",&local_89);
  pcVar1 = (c->_M_dataplus)._M_p;
  iVar2 = snprintf((char *)0x0,0,
                   (char *)weak.
                           super___weak_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,pcVar1,(ulong)mode);
  __maxlen = (ulong)(iVar2 + 1);
  __s.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)operator_new__(__maxlen);
  local_88._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (tuple<char_*,_std::default_delete<char[]>_>)
       __s.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  snprintf((char *)__s.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl,__maxlen,
           (char *)weak.super___weak_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           ,pcVar1,(ulong)mode);
  key._M_dataplus._M_p = (pointer)&key.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&key,
             __s.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl,
             (char *)((long)__s.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                            super__Head_base<0UL,_char_*,_false>._M_head_impl + __maxlen) + -1);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_88);
  std::__cxx11::string::~string((string *)&weak);
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&componentCache_abi_cxx11_._M_h,&key);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::__weak_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              (&weak.super___weak_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>,
               (__weak_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)iVar3.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>,_true>
                      ._M_cur + 0x28));
    std::__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> *)this,
               &weak.super___weak_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>);
    if ((this->super_IPreferences)._vptr_IPreferences != (_func_int **)0x0) {
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                (&weak.super___weak_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      goto LAB_001d2397;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->mutex);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&weak.super___weak_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  this_00 = (Preferences *)operator_new(0x68);
  Preferences(this_00,c,mode);
  std::__shared_ptr<f8n::prefs::Preferences,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<f8n::prefs::Preferences,void>
            ((__shared_ptr<f8n::prefs::Preferences,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  this_01 = (__weak_ptr<f8n::prefs::Preferences,(__gnu_cxx::_Lock_policy)2> *)
            std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&componentCache_abi_cxx11_,&key);
  std::__weak_ptr<f8n::prefs::Preferences,(__gnu_cxx::_Lock_policy)2>::operator=
            (this_01,(__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> *)this);
LAB_001d2397:
  std::__cxx11::string::~string((string *)&key);
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  sVar4.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<f8n::prefs::Preferences>)
         sVar4.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Preferences> Preferences::ForComponent(
    const std::string& c, Preferences::Mode mode)
{
    std::unique_lock<std::mutex> lock(cacheMutex);

    std::string key = CACHE_KEY(c, mode);

    auto it = componentCache.find(key);
    if (it != componentCache.end()) {
        auto weak = it->second;
        try {
            auto shared = weak.lock();
            if (shared) {
                return shared;
            }
        }
        catch (...) {
            /* unable to lock, let's create a new one... */
        }
    }

    std::shared_ptr<Preferences> prefs(new Preferences(c, mode));
    componentCache[key] = prefs;
    return prefs;
}